

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O0

int __thiscall
beagle::cpu::BeagleCPUImpl<float,_1,_0>::calcRootLogLikelihoodsPerCategory
          (BeagleCPUImpl<float,_1,_0> *this,int bufferIndex,int stateFrequenciesIndex,
          int scalingFactorsIndex,double *outLogLikelihoodPerCategory)

{
  long lVar1;
  long lVar2;
  undefined1 auVar3 [16];
  int in_ECX;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  long in_R8;
  double dVar4;
  int i_1;
  int l_1;
  int u_1;
  float *cumulativeScaleFactors;
  int i;
  float sum;
  int k;
  int l;
  int v;
  int u;
  float *freqs;
  float *rootPartials;
  int returnCode;
  undefined4 local_64;
  undefined4 local_60;
  undefined4 local_5c;
  undefined4 local_50;
  undefined4 local_4c;
  undefined4 local_48;
  undefined4 local_44;
  undefined4 local_40;
  undefined4 local_3c;
  
  lVar1 = *(long *)(*(long *)(in_RDI + 0xa8) + (long)in_ESI * 8);
  lVar2 = *(long *)(*(long *)(in_RDI + 0xa0) + (long)in_EDX * 8);
  local_3c = 0;
  local_40 = 0;
  for (local_44 = 0; local_44 < *(int *)(in_RDI + 0x34); local_44 = local_44 + 1) {
    for (local_48 = 0; local_48 < *(int *)(in_RDI + 0x14); local_48 = local_48 + 1) {
      local_4c = 0.0;
      for (local_50 = 0; local_50 < *(int *)(in_RDI + 0x24); local_50 = local_50 + 1) {
        auVar3 = vfmadd213ss_fma(ZEXT416(*(uint *)(lVar2 + (long)local_50 * 4)),
                                 ZEXT416(*(uint *)(lVar1 + (long)local_40 * 4)),
                                 ZEXT416((uint)local_4c));
        local_4c = auVar3._0_4_;
        local_40 = local_40 + 1;
      }
      dVar4 = log((double)local_4c);
      *(double *)(in_R8 + (long)local_3c * 8) = dVar4;
      local_3c = local_3c + 1;
    }
  }
  if (-1 < in_ECX) {
    lVar1 = *(long *)(*(long *)(in_RDI + 0xb8) + (long)in_ECX * 8);
    local_5c = 0;
    for (local_60 = 0; local_60 < *(int *)(in_RDI + 0x34); local_60 = local_60 + 1) {
      for (local_64 = 0; local_64 < *(int *)(in_RDI + 0x14); local_64 = local_64 + 1) {
        *(double *)(in_R8 + (long)local_5c * 8) =
             (double)*(float *)(lVar1 + (long)local_64 * 4) +
             *(double *)(in_R8 + (long)local_5c * 8);
        local_5c = local_5c + 1;
      }
    }
  }
  return 0;
}

Assistant:

BEAGLE_CPU_TEMPLATE
int BeagleCPUImpl<BEAGLE_CPU_GENERIC>::calcRootLogLikelihoodsPerCategory(
        const int bufferIndex,
        const int stateFrequenciesIndex,
        const int scalingFactorsIndex,
        double* outLogLikelihoodPerCategory) {

    int returnCode = BEAGLE_SUCCESS;

    const REALTYPE* rootPartials = gPartials[bufferIndex];
    const REALTYPE* freqs = gStateFrequencies[stateFrequenciesIndex];

    int u = 0;
    int v = 0;
    for (int l = 0; l < kCategoryCount; l++) {
        for (int k = 0; k < kPatternCount; k++) {
            REALTYPE sum = 0.0;
            for (int i = 0; i < kStateCount; i++) {
                sum += rootPartials[v] * freqs[i];
                v++;
            }
            outLogLikelihoodPerCategory[u] = log(sum);
            u++;
            v += P_PAD;
        }
    }

    if (scalingFactorsIndex >= 0) {
        const REALTYPE* cumulativeScaleFactors = gScaleBuffers[scalingFactorsIndex];
        int u = 0;
        for (int l = 0; l < kCategoryCount; l++) {
            for (int i = 0; i < kPatternCount; i++) {
                outLogLikelihoodPerCategory[u] += cumulativeScaleFactors[i];
                u++;
            }
        }
    }

    return returnCode;
}